

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

void __thiscall BoardView::~BoardView(BoardView *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar2;
  undefined4 extraout_var_03;
  
  if (this->m_validBoard == true) {
    iVar1 = (*this->m_board->_vptr_Board[2])();
    std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::clear
              ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
               CONCAT44(extraout_var,iVar1));
    iVar1 = (*this->m_board->_vptr_Board[4])();
    std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::clear
              ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
               CONCAT44(extraout_var_00,iVar1));
    iVar1 = (*this->m_board->_vptr_Board[3])();
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::clear
              ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
               CONCAT44(extraout_var_01,iVar1));
    iVar1 = (*this->m_board->_vptr_Board[5])();
    std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::clear
              ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *)
               CONCAT44(extraout_var_02,iVar1));
    iVar1 = (*this->m_board->_vptr_Board[6])();
    plVar2 = (long *)CONCAT44(extraout_var_03,iVar1);
    if (plVar2[1] != *plVar2) {
      plVar2[1] = *plVar2;
    }
    if (this->m_file != (BRDFileBase *)0x0) {
      (*this->m_file->_vptr_BRDFileBase[1])();
    }
    if (this->m_board != (Board *)0x0) {
      (*this->m_board->_vptr_Board[1])();
    }
    Annotations::Close(&this->m_annotations);
    this->m_validBoard = false;
  }
  std::__cxx11::string::~string((string *)&this->m_error_msg);
  std::__cxx11::string::~string((string *)&this->m_lastFileOpenName);
  std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::~vector(&this->m_nets);
  ImVector<char>::~ImVector(&this->m_cachedDrawCommands);
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::~vector
            (&this->m_partHighlighted);
  std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::~vector
            (&this->m_pinHighlighted);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->currentlyHoveredPart).super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->currentlyHoveredPin).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_pinHighlightedHovered).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Annotations::~Annotations(&this->m_annotations);
  PDFFile::~PDFFile(&this->pdfFile);
  PDFBridgeEvince::~PDFBridgeEvince(&this->pdfBridge);
  Preferences::BoardSettings::~BoardSettings(&this->boardSettings);
  Preferences::Keyboard::~Keyboard(&this->keyboardPreferences);
  Config::~Config(&(this->programPreferences).configCopy);
  Config::~Config(&this->config);
  KeyBindings::~KeyBindings(&this->keybindings);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->scparts).dictionary);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->scnets).dictionary);
  Searcher::~Searcher(&this->searcher);
  FHistory::~FHistory(&this->fhistory);
  Confparse::~Confparse(&this->obvconfig);
  BackgroundImage::~BackgroundImage(&this->backgroundImage);
  return;
}

Assistant:

BoardView::~BoardView() {
	if (m_validBoard) {
		m_board->Nets().clear();
		m_board->Pins().clear();
		m_board->Components().clear();
		m_board->OutlinePoints().clear();
		m_board->OutlineSegments().clear();
		delete m_file;
		delete m_board;
		m_annotations.Close();
		m_validBoard = false;
	}
}